

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Statements.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseBreakStatement_AtFirst
          (Parser *this,StatementSyntax **stmt,StatementContext stmtCtx)

{
  bool bVar1;
  bool bVar2;
  SyntaxToken *pSVar3;
  BreakStatementSyntax *pBVar4;
  IndexType IVar5;
  ostream *poVar6;
  
  pSVar3 = peek(this,1);
  if (pSVar3->syntaxK_ == Keyword_break) {
    pBVar4 = makeNode<psy::C::BreakStatementSyntax>(this);
    *stmt = &pBVar4->super_StatementSyntax;
    IVar5 = consume(this);
    pBVar4->breakKwTkIdx_ = IVar5;
    bVar1 = match(this,SemicolonToken,&pBVar4->semicolonTkIdx_);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = ignoreStatement(this);
      return bVar2;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Statements.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x329);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"assert failure: `break\'",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Parser::parseBreakStatement_AtFirst(StatementSyntax*& stmt,
                                         StatementContext stmtCtx)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_break,
                     return false,
                     "assert failure: `break'");

    auto breakStmt = makeNode<BreakStatementSyntax>();
    stmt = breakStmt;
    breakStmt->breakKwTkIdx_ = consume();

    return checkStatementParse(
                match(SyntaxKind::SemicolonToken, &breakStmt->semicolonTkIdx_));
}